

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O0

char __thiscall Json::JsonParser::convert2escape(JsonParser *this,char sn)

{
  char local_12;
  char c;
  char sn_local;
  JsonParser *this_local;
  
  switch(sn) {
  case '\"':
    local_12 = '\"';
    break;
  default:
    local_12 = sn;
    break;
  case '\'':
    local_12 = '\'';
    break;
  case '0':
    local_12 = '\0';
    break;
  case '?':
    local_12 = '?';
    break;
  case '\\':
    local_12 = '\\';
    break;
  case 'a':
    local_12 = '\a';
    break;
  case 'b':
    local_12 = '\b';
    break;
  case 'f':
    local_12 = '\f';
    break;
  case 'n':
    local_12 = '\n';
    break;
  case 'r':
    local_12 = '\r';
    break;
  case 't':
    local_12 = '\t';
    break;
  case 'v':
    local_12 = '\v';
  }
  return local_12;
}

Assistant:

char Json::JsonParser::convert2escape(char sn) {
    char c;
    switch (sn) {
        case 'a':
            c = '\a';
            break;
        case 'b':
            c = '\b';
            break;
        case 'f':
            c = '\f';
            break;
        case 'r':
            c = '\r';
            break;
        case 't':
            c = '\t';
            break;
        case 'v':
            c = '\v';
            break;
        case '\'':
            c = '\'';
            break;
        case '\"':
            c = '\"';
            break;
        case '?':
            c = '\?';
            break;
        case 'n':
            c = '\n';
            break;
        case '0':
            c = '\0';
            break;
        case '\\':
            c = '\\';
            break;
        default:
            c = sn;
            break;
    }
    return c;
}